

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall fizplex::Base::btran(Base *this,DVector *vec)

{
  double dVar1;
  double *pdVar2;
  pointer pEVar3;
  pointer pNVar4;
  size_t i;
  ulong i_00;
  long lVar5;
  bool bVar6;
  DVector w;
  double local_58;
  DVector local_48;
  
  DVector::DVector(&local_48,this->m);
  for (i_00 = 0; i_00 < this->m; i_00 = i_00 + 1) {
    pdVar2 = DVector::operator[](vec,(this->row_ordering)._M_t.
                                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                     .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                     [i_00]);
    dVar1 = *pdVar2;
    pdVar2 = DVector::operator[](&local_48,i_00);
    *pdVar2 = dVar1;
  }
  lVar5 = (long)(this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    pEVar3 = (this->etms).
             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar4 = *(pointer *)&pEVar3[lVar5].eta.values;
    local_58 = 0.0;
    for (; pNVar4 != *(pointer *)((long)&pEVar3[lVar5].eta.values + 8); pNVar4 = pNVar4 + 1) {
      dVar1 = pNVar4->value;
      pdVar2 = DVector::operator[](&local_48,pNVar4->index);
      local_58 = local_58 + dVar1 * *pdVar2;
      pEVar3 = (this->etms).
               super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar2 = DVector::operator[](&local_48,pEVar3[lVar5].col);
    *pdVar2 = local_58;
  }
  DVector::operator=(vec,&local_48);
  operator_delete(local_48.vals._M_data);
  return;
}

Assistant:

void Base::btran(DVector &vec) const {
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[i] = vec[row_ordering[i]];

  for (size_t i = etms.size(); i-- > 0;) {
    double d = 0.0;
    for (auto it = etms[i].eta.cbegin(); it != etms[i].eta.cend(); ++it)
      d += it->value * w[it->index];
    w[etms[i].col] = d;
  }

  vec = w;
}